

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type __thiscall wasm::anon_unknown_0::TupleStore::insert(TupleStore *this,Tuple *info)

{
  Type TVar1;
  Tuple *info_local;
  TupleStore *this_local;
  
  TVar1 = wasm::(anonymous_namespace)::TupleStore::
          doInsert<std::vector<wasm::Type,std::allocator<wasm::Type>>const>((TupleStore *)this,info)
  ;
  return (Type)TVar1.id;
}

Assistant:

Type insert(const Tuple& info) { return doInsert(info); }